

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  string_view *psVar1;
  UdpInitialStmtSyntax *this;
  Info *pIVar2;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __x;
  Token nameToken;
  basic_string_view<char,_std::char_traits<char>_> __y;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  *pvVar3;
  Expression *expr_00;
  undefined1 auVar4 [8];
  size_t sVar5;
  PrimitivePortSymbol *pPVar6;
  UdpDeclarationSyntax *pUVar7;
  bool bVar8;
  bitwidth_t bVar9;
  int iVar10;
  Compilation *args;
  PrimitiveSymbol *pPVar11;
  UdpPortListSyntax *pUVar12;
  SyntaxNode *pSVar13;
  AnsiUdpPortListSyntax *pAVar14;
  UdpInputPortDeclSyntax *pUVar15;
  IdentifierNameSyntax *pIVar16;
  UdpBodySyntax *pUVar17;
  UdpPortDeclSyntax *pUVar18;
  NonAnsiUdpPortListSyntax *pNVar19;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
  *ppVar20;
  SyntaxNode *pSVar21;
  logic_error *this_00;
  size_type sVar22;
  reference ppPVar23;
  UdpOutputPortDeclSyntax *pUVar24;
  Diagnostic *pDVar25;
  SourceLocation noteLocation;
  undefined4 extraout_var;
  Type *this_01;
  SVInt *pSVar26;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_12;
  iterator iVar27;
  iterator iVar28;
  iterator iVar29;
  iterator iVar30;
  SourceRange SVar31;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_bool>
  pVar32;
  iterator iVar33;
  Token TVar34;
  string_view sVar35;
  LookupLocation lookupLocation;
  bool local_e79;
  span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL> local_8a8;
  span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> local_898;
  SourceLocation local_888;
  SourceLocation SStack_880;
  undefined4 local_870;
  undefined1 local_86a;
  uint8_t local_869;
  SVInt local_868;
  logic_t local_851;
  SVInt local_850;
  logic_t local_83a;
  logic_t local_839;
  SVInt *local_838;
  SVInt *val;
  ConstantValue local_828;
  bitmask<slang::ast::ASTFlags> local_800;
  Expression *local_7f8;
  Expression *expr;
  undefined8 local_7e8;
  undefined4 uStack_7e0;
  undefined4 uStack_7dc;
  undefined1 local_7d0 [8];
  ASTContext context;
  Diagnostic *diag_6;
  undefined1 auStack_730 [8];
  string_view initialName;
  Diagnostic *diag_5;
  UdpInitialStmtSyntax *initial;
  ulong local_6b0;
  size_t i;
  UdpOutputPortDeclSyntax *outSyntax;
  SyntaxNode *portSyntax;
  ExpressionSyntax *initExpr;
  string local_670;
  allocator<char> local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  pointer local_5a8;
  pointer pvStack_5a0;
  SourceLocation local_590;
  undefined4 local_584;
  Diagnostic *local_580;
  Diagnostic *diag_4;
  PrimitivePortSymbol *port_6;
  iterator __end4_2;
  iterator __begin4_2;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *__range4_2;
  char *pcStack_550;
  SourceRange local_548;
  DiagCode local_534;
  Diagnostic *local_530;
  Diagnostic *diag_3;
  SyntaxNode *pSStack_520;
  PrimitivePortSymbol *local_510;
  PrimitivePortSymbol *port_5;
  string_view local_500;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_4f0;
  iterator it_2;
  Token name_3;
  Diagnostic *diag_2;
  SourceLocation local_490;
  EntryPointer local_488;
  Info *pIStack_480;
  PrimitivePortSymbol *local_470;
  PrimitivePortSymbol *port_4;
  string_view local_460;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_450;
  iterator it_1;
  Token name_2;
  IdentifierNameSyntax *nameSyntax_2;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range6;
  UdpInputPortDeclSyntax *inputDecl_1;
  Diagnostic *diag_1;
  SourceLocation local_3c0;
  undefined8 local_3b8;
  size_t sStack_3b0;
  PrimitivePortSymbol *local_3a0;
  PrimitivePortSymbol *port_3;
  DiagCode local_38c;
  SourceRange local_388;
  DiagCode local_374;
  Diagnostic *local_370;
  Diagnostic *diag;
  string_view local_360;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
  local_350;
  iterator it;
  UdpOutputPortDeclSyntax *outputDecl_1;
  UdpPortDeclSyntax *decl_1;
  iterator __end4_1;
  iterator __begin4_1;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range4_1;
  UdpOutputPortDeclSyntax *regSpecifier;
  anon_class_8_1_a89d2d74 checkDup;
  string_view local_2f0;
  string_view local_2e0;
  PrimitivePortDirection local_2cc;
  SourceLocation local_2c8;
  string_view local_2c0;
  PrimitivePortSymbol *local_2b0;
  PrimitivePortSymbol *port_2;
  Token name_1;
  IdentifierNameSyntax *nameSyntax_1;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range4;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
  portMap;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_1a0;
  PrimitivePortDirection local_18c;
  SourceLocation local_188;
  string_view local_180;
  PrimitivePortSymbol *local_170;
  PrimitivePortSymbol *port_1;
  Token name;
  IdentifierNameSyntax *nameSyntax;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range5;
  UdpInputPortDeclSyntax *inputDecl;
  SourceLocation local_108;
  string_view local_100;
  PrimitivePortSymbol *local_f0;
  PrimitivePortSymbol *port;
  UdpOutputPortDeclSyntax *pUStack_e0;
  PrimitivePortDirection dir;
  UdpOutputPortDeclSyntax *outputDecl;
  UdpPortDeclSyntax *decl;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range3;
  undefined1 local_98 [8];
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PrimitiveKind local_44;
  SourceLocation local_40;
  string_view local_38;
  PrimitiveSymbol *local_28;
  PrimitiveSymbol *prim;
  Compilation *comp;
  UdpDeclarationSyntax *syntax_local;
  Scope *scope_local;
  
  comp = (Compilation *)syntax;
  syntax_local = (UdpDeclarationSyntax *)scope;
  args = Scope::getCompilation(scope);
  prim = (PrimitiveSymbol *)args;
  local_38 = parsing::Token::valueText
                       ((Token *)&(comp->options).topModules.
                                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  .hash_policy);
  local_40 = parsing::Token::location
                       ((Token *)&(comp->options).topModules.
                                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  .hash_policy);
  local_44 = UserDefined;
  pPVar11 = BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&args->super_BumpAllocator,args,&local_38,&local_40,&local_44);
  pUVar7 = syntax_local;
  local_28 = pPVar11;
  join_0x00000010_0x00000000_ =
       slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&comp->options);
  Symbol::setAttributes(&pPVar11->super_Symbol,(Scope *)pUVar7,join_0x00000010_0x00000000_);
  Symbol::setSyntax(&local_28->super_Symbol,(SyntaxNode *)comp);
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)local_98);
  pUVar12 = not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                      ((not_null<slang::syntax::UdpPortListSyntax_*> *)
                       &(comp->options).paramOverrides);
  if ((pUVar12->super_SyntaxNode).kind == AnsiUdpPortList) {
    pSVar13 = &not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                         ((not_null<slang::syntax::UdpPortListSyntax_*> *)
                          &(comp->options).paramOverrides)->super_SyntaxNode;
    pAVar14 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiUdpPortListSyntax>(pSVar13);
    iVar27 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
                       (&pAVar14->ports);
    __end3.index = (size_t)iVar27.list;
    iVar28 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end
                       (&pAVar14->ports);
    while( true ) {
      __end3.list = (ParentList *)iVar28.index;
      decl = (UdpPortDeclSyntax *)iVar28.list;
      bVar8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
                            *)&__end3.index,
                           (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&decl);
      if (!bVar8) break;
      outputDecl = (UdpOutputPortDeclSyntax *)
                   slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                   iterator_base<slang::syntax::UdpPortDeclSyntax_*>::operator*
                             ((iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&__end3.index);
      if ((outputDecl->super_UdpPortDeclSyntax).super_SyntaxNode.kind == UdpOutputPortDecl) {
        pUStack_e0 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                               ((SyntaxNode *)outputDecl);
        port._4_4_ = 1;
        bVar8 = parsing::Token::operator_cast_to_bool(&pUStack_e0->reg);
        pPVar11 = prim;
        if (bVar8) {
          port._4_4_ = 2;
        }
        sVar35 = parsing::Token::valueText(&pUStack_e0->name);
        local_100 = sVar35;
        local_108 = parsing::Token::location(&pUStack_e0->name);
        local_f0 = BumpAllocator::
                   emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                             ((BumpAllocator *)pPVar11,(Compilation *)pPVar11,&local_100,&local_108,
                              (PrimitivePortDirection *)((long)&port + 4));
        Symbol::setSyntax((Symbol *)local_f0,(SyntaxNode *)outputDecl);
        pUVar7 = syntax_local;
        pPVar6 = local_f0;
        nonstd::span_lite::
        span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)&inputDecl,&(outputDecl->super_UdpPortDeclSyntax).attributes);
        Symbol::setAttributes((Symbol *)pPVar6,(Scope *)pUVar7,_inputDecl);
        SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,&local_f0);
        Scope::addMember(&local_28->super_Scope,(Symbol *)local_f0);
      }
      else {
        pUVar15 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                            ((SyntaxNode *)outputDecl);
        iVar29 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                           (&pUVar15->names);
        __end5.index = (size_t)iVar29.list;
        iVar30 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                           (&pUVar15->names);
        while( true ) {
          __end5.list = (ParentList *)iVar30.index;
          nameSyntax = (IdentifierNameSyntax *)iVar30.list;
          bVar8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                  ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                                *)&__end5.index,
                               (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&nameSyntax);
          if (!bVar8) break;
          pIVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*
                              ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&__end5.index
                              );
          pPVar11 = prim;
          port_1 = *(PrimitivePortSymbol **)&pIVar16->identifier;
          name._0_8_ = (pIVar16->identifier).info;
          sVar35 = parsing::Token::valueText((Token *)&port_1);
          local_180 = sVar35;
          local_188 = parsing::Token::location((Token *)&port_1);
          local_18c = In;
          local_170 = BumpAllocator::
                      emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                ((BumpAllocator *)pPVar11,(Compilation *)pPVar11,&local_180,
                                 &local_188,&local_18c);
          Symbol::setSyntax((Symbol *)local_170,(SyntaxNode *)pIVar16);
          pUVar7 = syntax_local;
          pPVar6 = local_170;
          nonstd::span_lite::
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                    (&local_1a0,&(outputDecl->super_UdpPortDeclSyntax).attributes);
          Symbol::setAttributes((Symbol *)pPVar6,(Scope *)pUVar7,local_1a0);
          SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,&local_170
                    );
          Scope::addMember(&local_28->super_Scope,(Symbol *)local_170);
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                        *)&__end5.index);
          iVar30.index = (size_t)__end5.list;
          iVar30.list = (ParentList *)nameSyntax;
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
                    *)&__end3.index);
      iVar28.index = (size_t)__end3.list;
      iVar28.list = (ParentList *)decl;
    }
    pUVar17 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                        ((not_null<slang::syntax::UdpBodySyntax_*> *)
                         &(comp->options).paramOverrides.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    bVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::empty
                      (&pUVar17->portDecls);
    pUVar7 = syntax_local;
    if (!bVar8) {
      pUVar17 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                          ((not_null<slang::syntax::UdpBodySyntax_*> *)
                           &(comp->options).paramOverrides.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      pUVar18 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                          (&pUVar17->portDecls,0);
      SVar31 = slang::syntax::SyntaxNode::sourceRange(&pUVar18->super_SyntaxNode);
      portMap.
      super_flat_hash_map<std::basic_string_view<char>,_slang::ast::PrimitivePortSymbol_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      .
      super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      .num_elements = (size_t)SVar31.startLoc;
      Scope::addDiag((Scope *)pUVar7,(DiagCode)0x770006,SVar31);
    }
  }
  else {
    pUVar12 = not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                        ((not_null<slang::syntax::UdpPortListSyntax_*> *)
                         &(comp->options).paramOverrides);
    if ((pUVar12->super_SyntaxNode).kind == NonAnsiUdpPortList) {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                  *)&__range4);
      pSVar13 = &not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                           ((not_null<slang::syntax::UdpPortListSyntax_*> *)
                            &(comp->options).paramOverrides)->super_SyntaxNode;
      pNVar19 = slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiUdpPortListSyntax>(pSVar13);
      iVar29 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                         (&pNVar19->ports);
      __end4.index = (size_t)iVar29.list;
      iVar29 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                         (&pNVar19->ports);
      while( true ) {
        __end4.list = (ParentList *)iVar29.index;
        nameSyntax_1 = (IdentifierNameSyntax *)iVar29.list;
        bVar8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                              *)&__end4.index,
                             (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&nameSyntax_1);
        if (!bVar8) break;
        name_1.info = (Info *)slang::syntax::
                              SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                              iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*
                                        ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                                         &__end4.index);
        pPVar11 = prim;
        port_2 = *(PrimitivePortSymbol **)&((IdentifierNameSyntax *)name_1.info)->identifier;
        name_1._0_8_ = (((IdentifierNameSyntax *)name_1.info)->identifier).info;
        sVar35 = parsing::Token::valueText((Token *)&port_2);
        local_2c0 = sVar35;
        local_2c8 = parsing::Token::location((Token *)&port_2);
        local_2cc = In;
        local_2b0 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                              ((BumpAllocator *)pPVar11,(Compilation *)pPVar11,&local_2c0,&local_2c8
                               ,&local_2cc);
        SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,&local_2b0);
        Scope::addMember(&local_28->super_Scope,(Symbol *)local_2b0);
        sVar35 = parsing::Token::valueText((Token *)&port_2);
        local_2e0 = sVar35;
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2e0);
        if (((bVar8 ^ 0xffU) & 1) != 0) {
          sVar35 = parsing::Token::valueText((Token *)&port_2);
          local_2f0 = sVar35;
          pVar32 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
                   ::
                   emplace<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                             ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
                               *)&portMap.
                                  super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                                  .ptr,&local_2f0,&local_2b0);
          checkDup.scope = (Scope *)pVar32.first.current;
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
        ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                      *)&__end4.index);
        iVar29.index = (size_t)__end4.list;
        iVar29.list = (ParentList *)nameSyntax_1;
      }
      regSpecifier = (UdpOutputPortDeclSyntax *)syntax_local;
      __range4_1 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x0;
      pUVar17 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                          ((not_null<slang::syntax::UdpBodySyntax_*> *)
                           &(comp->options).paramOverrides.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      iVar27 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
                         (&pUVar17->portDecls);
      __end4_1.index = (size_t)iVar27.list;
      iVar27 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end
                         (&pUVar17->portDecls);
      while( true ) {
        __end4_1.list = (ParentList *)iVar27.index;
        decl_1 = (UdpPortDeclSyntax *)iVar27.list;
        bVar8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
                ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
                              *)&__end4_1.index,
                             (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&decl_1);
        if (!bVar8) break;
        pUVar18 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                  iterator_base<slang::syntax::UdpPortDeclSyntax_*>::operator*
                            ((iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&__end4_1.index);
        if ((pUVar18->super_SyntaxNode).kind == UdpOutputPortDecl) {
          it.current = (EntryPointer)
                       slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                                 (&pUVar18->super_SyntaxNode);
          sVar35 = parsing::Token::valueText(&((UdpOutputPortDeclSyntax *)it.current)->name);
          local_360 = sVar35;
          local_350.current =
               (EntryPointer)
               ska::detailv3::
               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
               ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                       *)&portMap.
                          super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                          .ptr,&local_360);
          diag = (Diagnostic *)
                 ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                 ::end((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                        *)&portMap.
                           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                           .ptr);
          bVar8 = ska::detailv3::operator!=
                            (&local_350,
                             (templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                              *)&diag);
          pUVar7 = syntax_local;
          if (bVar8) {
            bVar8 = parsing::Token::operator_cast_to_bool
                              ((Token *)&it.current[2].field_1.value.first._M_str);
            if (bVar8) {
              bVar8 = parsing::Token::operator_cast_to_bool((Token *)(it.current + 2));
              pUVar7 = syntax_local;
              if (!bVar8) {
                if (__range4_1 != (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x0) {
                  local_374.subsystem = Declarations;
                  local_374.code = 0x81;
                  SVar31 = parsing::Token::range((Token *)&it.current[2].field_1.value.first._M_str)
                  ;
                  local_388 = SVar31;
                  pDVar25 = Scope::addDiag((Scope *)pUVar7,local_374,SVar31);
                  local_38c.subsystem = General;
                  local_38c.code = 8;
                  local_370 = pDVar25;
                  port_3 = (PrimitivePortSymbol *)
                           parsing::Token::location((Token *)&__range4_1[1].elements);
                  Diagnostic::addNote(pDVar25,local_38c,(SourceLocation)port_3);
                }
                __range4_1 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)it.current;
                goto LAB_002d226a;
              }
            }
            ppVar20 = ska::detailv3::
                      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                      ::
                      templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                      ::operator->(&local_350);
            local_3a0 = ppVar20->second;
            local_3b8 = *(undefined8 *)(it.current + 3);
            sStack_3b0 = it.current[3].field_1.value.first._M_len;
            fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
            operator()(&regSpecifier,local_3a0,*(Token *)(it.current + 3));
            local_3a0->direction = Out;
            bVar8 = parsing::Token::operator_cast_to_bool
                              ((Token *)&it.current[2].field_1.value.first._M_str);
            if (bVar8) {
              local_3a0->direction = OutReg;
            }
            local_3c0 = parsing::Token::location((Token *)(it.current + 3));
            (local_3a0->super_ValueSymbol).super_Symbol.location = local_3c0;
            Symbol::setSyntax((Symbol *)local_3a0,(SyntaxNode *)it.current);
            pUVar7 = syntax_local;
            pPVar6 = local_3a0;
            nonstd::span_lite::
            span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
            span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                      ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                        *)&diag_1,&pUVar18->attributes);
            Symbol::setAttributes((Symbol *)pPVar6,(Scope *)pUVar7,_diag_1);
          }
          else {
            SVar31 = parsing::Token::range((Token *)(it.current + 3));
            pDVar25 = Scope::addDiag((Scope *)pUVar7,(DiagCode)0x800006,SVar31);
            sVar35 = parsing::Token::valueText((Token *)(it.current + 3));
            Diagnostic::operator<<(pDVar25,sVar35);
          }
        }
        else {
          pUVar15 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                              (&pUVar18->super_SyntaxNode);
          iVar29 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                             (&pUVar15->names);
          __end6.index = (size_t)iVar29.list;
          iVar33 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                             (&pUVar15->names);
          while( true ) {
            __end6.list = (ParentList *)iVar33.index;
            nameSyntax_2 = (IdentifierNameSyntax *)iVar33.list;
            bVar8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                    ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                                  *)&__end6.index,
                                 (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                                 &nameSyntax_2);
            if (!bVar8) break;
            pIVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                      iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*
                                ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                                 &__end6.index);
            it_1.current = *(EntryPointer *)&pIVar16->identifier;
            pIVar2 = (pIVar16->identifier).info;
            sVar35 = parsing::Token::valueText((Token *)&it_1);
            local_460 = sVar35;
            local_450.current =
                 (EntryPointer)
                 ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                 ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                         *)&portMap.
                            super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                            .ptr,&local_460);
            port_4 = (PrimitivePortSymbol *)
                     ska::detailv3::
                     sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                     ::end((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                            *)&portMap.
                               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                               .ptr);
            bVar8 = ska::detailv3::operator!=
                              (&local_450,
                               (templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                                *)&port_4);
            pUVar7 = syntax_local;
            if (bVar8) {
              ppVar20 = ska::detailv3::
                        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                        ::
                        templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                        ::operator->(&local_450);
              local_470 = ppVar20->second;
              local_488 = it_1.current;
              nameToken.info = pIVar2;
              nameToken._0_8_ = it_1.current;
              pIStack_480 = pIVar2;
              fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
              operator()(&regSpecifier,local_470,nameToken);
              local_490 = parsing::Token::location((Token *)&it_1);
              (local_470->super_ValueSymbol).super_Symbol.location = local_490;
              Symbol::setSyntax((Symbol *)local_470,(SyntaxNode *)pIVar16);
              pUVar7 = syntax_local;
              pPVar6 = local_470;
              nonstd::span_lite::
              span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
              span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,_0>
                        ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                          *)&diag_2,&pUVar18->attributes);
              Symbol::setAttributes((Symbol *)pPVar6,(Scope *)pUVar7,_diag_2);
            }
            else {
              SVar31 = parsing::Token::range((Token *)&it_1);
              pDVar25 = Scope::addDiag((Scope *)pUVar7,(DiagCode)0x800006,SVar31);
              sVar35 = parsing::Token::valueText((Token *)&it_1);
              Diagnostic::operator<<(pDVar25,sVar35);
            }
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
            ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                          *)&__end6.index);
            iVar33.index = (size_t)__end6.list;
            iVar33.list = (ParentList *)nameSyntax_2;
          }
        }
LAB_002d226a:
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
        ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::UdpPortDeclSyntax_*,_unsigned_long,_slang::syntax::UdpPortDeclSyntax_**,_slang::syntax::UdpPortDeclSyntax_*&>
                      *)&__end4_1.index);
        iVar27.index = (size_t)__end4_1.list;
        iVar27.list = (ParentList *)decl_1;
      }
      if (__range4_1 != (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x0) {
        it_2.current = (EntryPointer)__range4_1[2].super_SyntaxListBase._vptr_SyntaxListBase;
        pSVar13 = __range4_1[2].super_SyntaxListBase.super_SyntaxNode.parent;
        local_500 = parsing::Token::valueText((Token *)&it_2);
        local_4f0.current =
             (EntryPointer)
             ska::detailv3::
             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
             ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                     *)&portMap.
                        super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                        .ptr,&local_500);
        port_5 = (PrimitivePortSymbol *)
                 ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                 ::end((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                        *)&portMap.
                           super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                           .ptr);
        bVar8 = ska::detailv3::operator!=
                          (&local_4f0,
                           (templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                            *)&port_5);
        if (((bVar8 ^ 0xffU) & 1) != 0) {
          assert::assertFailed
                    ("it != portMap.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,0x36b,
                     "static PrimitiveSymbol &slang::ast::PrimitiveSymbol::fromSyntax(const Scope &, const UdpDeclarationSyntax &)"
                    );
        }
        ppVar20 = ska::detailv3::
                  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                  ::
                  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>
                  ::operator->(&local_4f0);
        local_510 = ppVar20->second;
        pSVar21 = Symbol::getSyntax((Symbol *)local_510);
        pUVar7 = syntax_local;
        if (pSVar21 != (SyntaxNode *)0x0) {
          if (local_510->direction == OutReg) {
            diag_3 = (Diagnostic *)it_2.current;
            TVar34.info = (Info *)pSVar13;
            TVar34._0_8_ = it_2.current;
            pSStack_520 = pSVar13;
            fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
            operator()(&regSpecifier,local_510,TVar34);
          }
          else if (local_510->direction == In) {
            local_534.subsystem = Declarations;
            local_534.code = 0x82;
            local_548 = parsing::Token::range((Token *)&it_2);
            local_530 = Scope::addDiag((Scope *)pUVar7,local_534,local_548);
            psVar1 = &(local_510->super_ValueSymbol).super_Symbol.name;
            __range4_2 = (SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)psVar1->_M_len
            ;
            pcStack_550 = (local_510->super_ValueSymbol).super_Symbol.name._M_str;
            Diagnostic::operator<<(local_530,*psVar1);
          }
          else {
            local_510->direction = OutReg;
          }
        }
      }
      __begin4_2 = (iterator)local_98;
      __end4_2 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::begin
                           ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)__begin4_2);
      port_6 = (PrimitivePortSymbol *)
               SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::end
                         ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)__begin4_2);
      for (; (PrimitivePortSymbol *)__end4_2 != port_6; __end4_2 = __end4_2 + 1) {
        diag_4 = (Diagnostic *)*__end4_2;
        pSVar13 = Symbol::getSyntax((Symbol *)diag_4);
        if (pSVar13 == (SyntaxNode *)0x0) {
          local_584 = 0x7f0006;
          local_590 = (SourceLocation)
                      (diag_4->ranges).
                      super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_580 = Scope::addDiag((Scope *)syntax_local,(DiagCode)0x7f0006,local_590);
          pvVar3 = &diag_4->args;
          local_5a8 = (pvVar3->
                      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          pvStack_5a0 = (diag_4->args).
                        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          sVar35._M_len =
               (size_t)(pvVar3->
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          sVar35._M_str =
               (char *)(pvVar3->
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage;
          Diagnostic::operator<<(local_580,sVar35);
        }
      }
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                   *)&__range4);
    }
    else {
      pUVar12 = not_null<slang::syntax::UdpPortListSyntax_*>::operator->
                          ((not_null<slang::syntax::UdpPortListSyntax_*> *)
                           &(comp->options).paramOverrides);
      if ((pUVar12->super_SyntaxNode).kind != WildcardUdpPortList) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,&local_649);
        std::operator+(&local_628,&local_648,":");
        std::__cxx11::to_string(&local_670,0x387);
        std::operator+(&local_608,&local_628,&local_670);
        std::operator+(&local_5e8,&local_608,": ");
        std::operator+(&local_5c8,&local_5e8,"Default case should be unreachable!");
        std::logic_error::logic_error(this_00,(string *)&local_5c8);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  sVar22 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::size
                     ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98);
  if (sVar22 < 2) {
    Scope::addDiag((Scope *)syntax_local,(DiagCode)0x830006,(local_28->super_Symbol).location);
    src = extraout_RDX;
    goto LAB_002d3303;
  }
  ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                       ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,0);
  pUVar7 = syntax_local;
  if ((*ppPVar23)->direction == In) {
    ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,0);
    Scope::addDiag((Scope *)pUVar7,(DiagCode)0x7c0006,
                   ((*ppPVar23)->super_ValueSymbol).super_Symbol.location);
    src = extraout_RDX_00;
    goto LAB_002d3303;
  }
  portSyntax = (SyntaxNode *)0x0;
  ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                       ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,0);
  if ((*ppPVar23)->direction == OutReg) {
    local_28->isSequential = true;
    ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,0);
    pSVar13 = Symbol::getSyntax((Symbol *)*ppPVar23);
    if ((pSVar13 != (SyntaxNode *)0x0) && (pSVar13->kind == UdpOutputPortDecl)) {
      pUVar24 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>(pSVar13);
      if (pUVar24->initializer != (EqualsValueClauseSyntax *)0x0) {
        portSyntax = &not_null::operator_cast_to_ExpressionSyntax_
                                ((not_null *)&pUVar24->initializer->expr)->super_SyntaxNode;
      }
    }
  }
  local_6b0 = 1;
  while( true ) {
    sVar22 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::size
                       ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98);
    if (sVar22 <= local_6b0) break;
    ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,
                          local_6b0);
    pUVar7 = syntax_local;
    if ((*ppPVar23)->direction != In) {
      ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                           ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,
                            local_6b0);
      Scope::addDiag((Scope *)pUVar7,(DiagCode)0x790006,
                     ((*ppPVar23)->super_ValueSymbol).super_Symbol.location);
      break;
    }
    local_6b0 = local_6b0 + 1;
  }
  pUVar17 = not_null<slang::syntax::UdpBodySyntax_*>::operator->
                      ((not_null<slang::syntax::UdpBodySyntax_*> *)
                       &(comp->options).paramOverrides.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  pUVar7 = syntax_local;
  this = pUVar17->initialStmt;
  src = extraout_RDX_01;
  if (this != (UdpInitialStmtSyntax *)0x0) {
    if ((local_28->isSequential & 1U) == 0) {
      SVar31 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      Scope::addDiag((Scope *)pUVar7,(DiagCode)0x7b0006,SVar31);
      src = extraout_RDX_02;
    }
    else if (portSyntax == (SyntaxNode *)0x0) {
      portSyntax = &not_null::operator_cast_to_ExpressionSyntax_((not_null *)&this->value)->
                    super_SyntaxNode;
      sVar35 = parsing::Token::valueText(&this->name);
      initialName._M_len = (size_t)sVar35._M_str;
      auStack_730 = (undefined1  [8])sVar35._M_len;
      bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_730);
      src = extraout_RDX_04;
      if (!bVar8) {
        ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                             ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,0
                             );
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&((*ppPVar23)->super_ValueSymbol).super_Symbol.name);
        sVar5 = initialName._M_len;
        auVar4 = auStack_730;
        src = extraout_RDX_05;
        if (!bVar8) {
          ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                               ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98
                                ,0);
          __y._M_len = ((*ppPVar23)->super_ValueSymbol).super_Symbol.name._M_len;
          __y._M_str = ((*ppPVar23)->super_ValueSymbol).super_Symbol.name._M_str;
          __x._M_str = (char *)sVar5;
          __x._M_len = (size_t)auVar4;
          bVar8 = std::operator!=(__x,__y);
          pUVar7 = syntax_local;
          src = extraout_RDX_06;
          if (bVar8) {
            SVar31 = parsing::Token::range(&this->name);
            pDVar25 = Scope::addDiag((Scope *)pUVar7,(DiagCode)0x840006,SVar31);
            arg._M_str = (char *)initialName._M_len;
            arg._M_len = (size_t)auStack_730;
            Diagnostic::operator<<(pDVar25,arg);
            ppPVar23 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                 ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)
                                  local_98,0);
            context.assertionInstance =
                 *(AssertionInstanceDetails **)
                  &((*ppPVar23)->super_ValueSymbol).super_Symbol.location;
            Diagnostic::addNote(pDVar25,(DiagCode)0x40001,(SourceLocation)context.assertionInstance)
            ;
            src = extraout_RDX_07;
          }
        }
      }
    }
    else {
      SVar31 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      pDVar25 = Scope::addDiag((Scope *)pUVar7,(DiagCode)0x780006,SVar31);
      TVar34 = slang::syntax::SyntaxNode::getFirstToken(portSyntax);
      initialName._M_str = TVar34._0_8_;
      noteLocation = parsing::Token::location((Token *)&initialName._M_str);
      Diagnostic::addNote(pDVar25,(DiagCode)0x80001,noteLocation);
      src = extraout_RDX_03;
    }
  }
  pUVar7 = syntax_local;
  if (portSyntax == (SyntaxNode *)0x0) goto LAB_002d3303;
  local_7e8 = LookupLocation::max;
  uStack_7e0 = (undefined4)DAT_0091b918;
  uStack_7dc = (undefined4)((ulong)DAT_0091b918 >> 0x20);
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&expr,None);
  lookupLocation.index = uStack_7e0;
  lookupLocation.scope = (Scope *)local_7e8;
  lookupLocation._12_4_ = 0;
  ASTContext::ASTContext
            ((ASTContext *)local_7d0,(Scope *)pUVar7,lookupLocation,
             (bitmask<slang::ast::ASTFlags>)expr);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_800,None);
  iVar10 = Expression::bind((int)portSyntax,(sockaddr *)local_7d0,(socklen_t)local_800.m_bits);
  local_7f8 = (Expression *)CONCAT44(extraout_var,iVar10);
  bVar8 = Expression::bad(local_7f8);
  src = extraout_RDX_08;
  if (bVar8) goto LAB_002d3303;
  if (local_7f8->kind == IntegerLiteral) {
    this_01 = not_null<const_slang::ast::Type_*>::operator->(&local_7f8->type);
    bVar9 = Type::getBitWidth(this_01);
    if (bVar9 != 1) {
      bVar8 = Expression::isUnsizedInteger(local_7f8);
      src = extraout_RDX_09;
      if (!bVar8) goto LAB_002d32b0;
    }
    expr_00 = local_7f8;
    val._7_1_ = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask((bitmask<slang::ast::EvalFlags> *)((long)&val + 7));
    ASTContext::eval(&local_828,(ASTContext *)local_7d0,expr_00,val._7_1_);
    slang::ConstantValue::~ConstantValue(&local_828);
    src = extraout_RDX_10;
    if (local_7f8->constant != (ConstantValue *)0x0) {
      pSVar26 = slang::ConstantValue::integer(local_7f8->constant);
      local_838 = pSVar26;
      SVInt::SVInt<int,void>(&local_850,0);
      local_83a = SVInt::operator==(pSVar26,&local_850);
      pSVar26 = local_838;
      SVInt::SVInt<int,void>(&local_868,1);
      local_851 = SVInt::operator==(pSVar26,&local_868);
      local_839 = logic_t::operator||(&local_83a,&local_851);
      bVar9 = SVInt::getBitWidth(local_838);
      local_e79 = false;
      if (bVar9 == 1) {
        local_869 = (uint8_t)SVInt::operator[](local_838,0);
        local_86a = 0x80;
        local_e79 = exactlyEqual((logic_t)local_869,(logic_t)0x80);
      }
      bVar8 = operator||(local_839,local_e79);
      SVInt::~SVInt(&local_868);
      SVInt::~SVInt(&local_850);
      src = extraout_RDX_11;
      if (bVar8) {
        local_28->initVal = local_7f8->constant;
      }
    }
  }
LAB_002d32b0:
  if (local_28->initVal == (ConstantValue *)0x0) {
    local_870 = 0x7a0006;
    local_888 = (local_7f8->sourceRange).startLoc;
    SStack_880 = (local_7f8->sourceRange).endLoc;
    Scope::addDiag((Scope *)syntax_local,(DiagCode)0x7a0006,local_7f8->sourceRange);
    src = extraout_RDX_12;
  }
LAB_002d3303:
  iVar10 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)local_98,
                      (EVP_PKEY_CTX *)prim,src);
  local_8a8.data_ = (pointer)CONCAT44(extraout_var_00,iVar10);
  nonstd::span_lite::span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL,_0>(&local_898,&local_8a8);
  pPVar11 = local_28;
  (local_28->ports).data_ = local_898.data_;
  (local_28->ports).size_ = local_898.size_;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)local_98);
  return pPVar11;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, syntax.name.valueText(), syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    SmallVector<const PrimitivePortSymbol*> ports;
    if (syntax.portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : syntax.portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (syntax.portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : syntax.portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                if (auto it = portMap.find(outputDecl.name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, outputDecl.name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = outputDecl.name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, outputDecl.name.range());
                    diag << outputDecl.name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else if (syntax.portList->kind == SyntaxKind::WildcardUdpPortList) {
        // TODO:
    }
    else {
        ASSUME_UNREACHABLE;
    }

    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }
    }

    // TODO: body

    prim->ports = ports.copy(comp);
    return *prim;
}